

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void put4bitcmaptile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                    int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint32_t **ppuVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint local_3c;
  uint32_t _x;
  uint32_t *bw;
  uint32_t **PALmap;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  ppuVar1 = img->PALmap;
  _y_local = cp;
  for (PALmap._0_4_ = h; local_3c = w, (uint32_t)PALmap != 0; PALmap._0_4_ = (uint32_t)PALmap - 1) {
    for (; 1 < local_3c; local_3c = local_3c - 2) {
      puVar2 = ppuVar1[*pp];
      puVar3 = _y_local + 1;
      *_y_local = *puVar2;
      _y_local = _y_local + 2;
      *puVar3 = puVar2[1];
      pp = pp + 1;
    }
    if (local_3c != 0) {
      *_y_local = *ppuVar1[*pp];
      pp = pp + 1;
      _y_local = _y_local + 1;
    }
    _y_local = _y_local + toskew;
    pp = pp + fromskew / 2;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(put4bitcmaptile)
{
    uint32_t **PALmap = img->PALmap;

    (void)x;
    (void)y;
    fromskew /= 2;
    for (; h > 0; --h)
    {
        uint32_t *bw;
        UNROLL2(w, bw = PALmap[*pp++], *cp++ = *bw++);
        cp += toskew;
        pp += fromskew;
    }
}